

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

void __thiscall NDevice::NDevice(NDevice *this)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NDevice_002fa580;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)&this->name);
  this->numBytes = -1;
  this->byteOffset = -1;
  return;
}

Assistant:

NDevice::NDevice() : NetworkDataType() {
    name = "";
    numBytes = -1;
    byteOffset = -1;

}